

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

int __thiscall OpenMD::EAMAdapter::getNrho(EAMAdapter *this)

{
  FuncflParameters funcflParam;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 local_78;
  
  getFuncflParam((EAMAdapter *)funcflParam.dr);
  FuncflParameters::~FuncflParameters
            ((FuncflParameters *)CONCAT44(local_78,in_stack_ffffffffffffff70));
  return local_78;
}

Assistant:

int EAMAdapter::getNrho() {
    FuncflParameters funcflParam = getFuncflParam();
    return funcflParam.nrho;
  }